

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O2

sexp sexp_adjust_fields(sexp dstp,sexp_conflict *types,_func_sexp_void_ptr_sexp *adjust_fn,
                       void *adata)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  sexp_conflict psVar5;
  long lVar6;
  sexp psVar7;
  size_t sVar8;
  ulong uVar9;
  
  uVar4 = dstp->tag;
  psVar5 = types[uVar4];
  uVar1 = (psVar5->value).type.field_len_scale;
  lVar6 = *(long *)((long)&dstp->tag + (long)(psVar5->value).type.field_len_off);
  sVar2 = (psVar5->value).type.field_len_base;
  sVar3 = (psVar5->value).type.field_base;
  uVar9 = 0;
  do {
    if ((long)sVar2 + (ulong)uVar1 * lVar6 == uVar9) {
      return (sexp)&DAT_0000013e;
    }
    psVar7 = *(sexp *)((long)&dstp->tag + uVar9 * 8 + (long)sVar3);
    if (psVar7 == (sexp)0x0) {
      psVar7 = (sexp)0x0;
    }
    else if ((((ulong)psVar7 & 3) == 0) &&
            (psVar7 = (*adjust_fn)(adata,psVar7), ((ulong)psVar7 & 3) != 0)) {
      sVar8 = strlen(gc_heap_err_str);
      snprintf(gc_heap_err_str + sVar8,0x100 - sVar8," from adjust fields, tag=%u i=%d",(ulong)uVar4
               ,uVar9 & 0xffffffff);
      return (sexp)&DAT_0000003e;
    }
    *(sexp *)((long)&dstp->tag + uVar9 * 8 + (long)sVar3) = psVar7;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static sexp sexp_adjust_fields(sexp dstp, sexp* types, sexp (* adjust_fn)(void *, sexp), void *adata) {
  sexp_tag_t tag           = sexp_pointer_tag(dstp);
  sexp       type_spec     = types[tag];
  size_t     type_sexp_cnt = sexp_type_num_slots_of_object(type_spec, dstp);
  sexp*      vec           = (sexp*)((unsigned char*)dstp + sexp_type_field_base(type_spec));
  int        i;
  
  for (i = 0; i < type_sexp_cnt; i++) {
    sexp src = vec[i];
    sexp dst = src;
    if (src && sexp_pointerp(src)) {
      dst = adjust_fn(adata, src);
      if (!sexp_pointerp(dst)) { 
        size_t sz = strlen(gc_heap_err_str);
        snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust fields, tag=%u i=%d", tag, i);
        return SEXP_FALSE; }
    }
    vec[i] = dst;
  }
  return SEXP_TRUE;
}